

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcd2.c
# Opt level: O2

int bcd2_sub(long *bcd_low,long *bcd_high,long subend)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong *puVar9;
  long lVar10;
  long tmp_hi;
  long tmp_lo;
  
  bin_bcd2(subend,&tmp_lo,&tmp_hi);
  bVar2 = 0;
  lVar1 = 0;
  for (uVar5 = 0; uVar5 != 0xe; uVar5 = uVar5 + 1) {
    puVar4 = (uint *)bcd_low;
    if (6 < uVar5) {
      puVar4 = (uint *)bcd_high;
    }
    uVar7 = (uint)tmp_lo;
    bVar3 = bVar2;
    if (6 < uVar5) {
      uVar7 = (uint)tmp_hi;
      bVar3 = bVar2 - 0x1c;
    }
    uVar6 = 0xf << (bVar3 & 0x1f);
    lVar8 = (ulong)((uVar6 & *puVar4) >> (bVar3 & 0x3f)) -
            ((ulong)((uVar7 & uVar6) >> (bVar3 & 0x3f)) + lVar1);
    if (lVar8 < 0) {
      lVar1 = 1;
    }
    lVar10 = lVar8 + 10;
    if (lVar8 >= 0) {
      lVar10 = lVar8;
    }
    if (uVar5 < 7) {
      bVar3 = (char)uVar5 * '\x04';
      uVar7 = (0xf << (bVar2 & 0x1f) ^ 0xfffffffU) & (uint)*bcd_low;
      puVar9 = (ulong *)bcd_low;
    }
    else {
      bVar3 = bVar2 - 0x1c;
      uVar7 = (0xf << (bVar3 & 0x1f) ^ 0xfffffffU) & (uint)*bcd_high;
      puVar9 = (ulong *)bcd_high;
    }
    *puVar9 = lVar10 << (bVar3 & 0x3f) | (ulong)uVar7;
    bVar2 = bVar2 + 4;
  }
  return (int)lVar1;
}

Assistant:

int
bcd2_sub(long *bcd_low, long *bcd_high, long subend)
{
    long tmp_lo, tmp_hi, carry, res;
    int digit;

    bin_bcd2(subend, &tmp_lo, &tmp_hi);
    carry = 0;
    for (digit=0; digit < 14; digit++)
        {
        res = GET_DIGIT(digit, *bcd_low, *bcd_high); 
        res -= GET_DIGIT(digit, tmp_lo, tmp_hi);
        res -= carry;
        if (res < 0) 
			{
			res += 10;
			carry = 1;
			}
        SET_DIGIT(res, digit, bcd_low, bcd_high);
        }
    return(carry);
}